

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

int Cof_NodeDeref_rec(Cof_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Cof_Obj_t *pCVar4;
  Cof_Obj_t *pNode_local;
  
  if ((*(uint *)pNode >> 4 & 0xf) == 0) {
    pNode_local._4_4_ = 0;
  }
  else {
    uVar1 = (*(uint *)pNode >> 8) - 1 & 0xffffff;
    *(uint *)pNode = *(uint *)pNode & 0xff | uVar1 << 8;
    if (uVar1 == 0) {
      pCVar4 = Cof_ObjFanin(pNode,0);
      iVar2 = Cof_NodeDeref_rec(pCVar4);
      pCVar4 = Cof_ObjFanin(pNode,1);
      iVar3 = Cof_NodeDeref_rec(pCVar4);
      pNode_local._4_4_ = iVar2 + 1 + iVar3;
    }
    else {
      pNode_local._4_4_ = 0;
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Cof_NodeDeref_rec( Cof_Obj_t * pNode )
{
    if ( pNode->nFanins == 0 )
        return 0;
    if ( --pNode->nFanouts > 0 )
        return 0;
    return 1 + Cof_NodeDeref_rec( Cof_ObjFanin(pNode, 0) )
             + Cof_NodeDeref_rec( Cof_ObjFanin(pNode, 1) );
}